

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  __m128 _outp_5;
  __m128 _b_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_512_1;
  __m256 _p_256;
  __m128 _p_2;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_512;
  __m256 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_mul op;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  int local_a84;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  int local_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  int local_830;
  undefined8 *local_820;
  float *local_818;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  
  local_820 = in_RDX;
  local_818 = in_RSI;
  if (in_R8D == 0x10) {
    local_830 = 0;
    auVar15 = *in_RDI;
    for (; local_830 < in_ECX; local_830 = local_830 + 1) {
      auVar14 = vbroadcastss_avx512f(ZEXT416((uint)*local_818));
      auVar14 = vmulps_avx512f(auVar15,auVar14);
      local_900 = auVar14._0_8_;
      uStack_8f8 = auVar14._8_8_;
      uStack_8f0 = auVar14._16_8_;
      uStack_8e8 = auVar14._24_8_;
      uStack_8e0 = auVar14._32_8_;
      uStack_8d8 = auVar14._40_8_;
      uStack_8d0 = auVar14._48_8_;
      uStack_8c8 = auVar14._56_8_;
      *local_820 = local_900;
      local_820[1] = uStack_8f8;
      local_820[2] = uStack_8f0;
      local_820[3] = uStack_8e8;
      local_820[4] = uStack_8e0;
      local_820[5] = uStack_8d8;
      local_820[6] = uStack_8d0;
      local_820[7] = uStack_8c8;
      local_818 = local_818 + 1;
      local_820 = local_820 + 8;
    }
  }
  if (in_R8D == 8) {
    local_904 = 0;
    uVar7 = *(undefined8 *)*in_RDI;
    uVar8 = *(undefined8 *)(*in_RDI + 8);
    uVar9 = *(undefined8 *)(*in_RDI + 0x10);
    uVar10 = *(undefined8 *)(*in_RDI + 0x18);
    auVar15 = vinsertf64x4_avx512f
                        (ZEXT3264(*(undefined1 (*) [32])*in_RDI),*(undefined1 (*) [32])*in_RDI,1);
    for (; local_904 + 1 < in_ECX; local_904 = local_904 + 2) {
      fVar1 = *local_818;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      uStack_3d0 = auVar5._0_8_;
      uStack_3c8 = auVar5._8_8_;
      fVar1 = local_818[1];
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x30);
      uStack_390 = auVar6._0_8_;
      uStack_388 = auVar6._8_8_;
      auVar13._16_8_ = uStack_390;
      auVar13._0_16_ = auVar5;
      auVar13._24_8_ = uStack_388;
      auVar14 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_3c8,CONCAT816(uStack_3d0,auVar4))),auVar13,1);
      auVar14 = vmulps_avx512f(auVar15,auVar14);
      local_a40 = auVar14._0_8_;
      uStack_a38 = auVar14._8_8_;
      uStack_a30 = auVar14._16_8_;
      uStack_a28 = auVar14._24_8_;
      uStack_a20 = auVar14._32_8_;
      uStack_a18 = auVar14._40_8_;
      uStack_a10 = auVar14._48_8_;
      uStack_a08 = auVar14._56_8_;
      *local_820 = local_a40;
      local_820[1] = uStack_a38;
      local_820[2] = uStack_a30;
      local_820[3] = uStack_a28;
      local_820[4] = uStack_a20;
      local_820[5] = uStack_a18;
      local_820[6] = uStack_a10;
      local_820[7] = uStack_a08;
      local_818 = local_818 + 2;
      local_820 = local_820 + 8;
    }
    for (; local_904 < in_ECX; local_904 = local_904 + 1) {
      fVar1 = *local_818;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
      local_e0 = (float)uVar7;
      fStack_dc = (float)((ulong)uVar7 >> 0x20);
      fStack_d8 = (float)uVar8;
      fStack_d4 = (float)((ulong)uVar8 >> 0x20);
      fStack_d0 = (float)uVar9;
      fStack_cc = (float)((ulong)uVar9 >> 0x20);
      fStack_c8 = (float)uVar10;
      uStack_c4 = (undefined4)((ulong)uVar10 >> 0x20);
      local_100 = auVar5._0_4_;
      fStack_fc = auVar5._4_4_;
      fStack_f8 = auVar5._8_4_;
      fStack_f4 = auVar5._12_4_;
      fStack_f0 = auVar4._0_4_;
      fStack_ec = auVar4._4_4_;
      fStack_e8 = auVar4._8_4_;
      *local_820 = CONCAT44(fStack_dc * fStack_fc,local_e0 * local_100);
      local_820[1] = CONCAT44(fStack_d4 * fStack_f4,fStack_d8 * fStack_f8);
      local_820[2] = CONCAT44(fStack_cc * fStack_ec,fStack_d0 * fStack_f0);
      local_820[3] = CONCAT44(uStack_c4,fStack_c8 * fStack_e8);
      local_818 = local_818 + 1;
      local_820 = local_820 + 4;
    }
  }
  if (in_R8D == 4) {
    local_a84 = 0;
    uVar7 = *(undefined8 *)*in_RDI;
    uVar8 = *(undefined8 *)(*in_RDI + 8);
    auVar12._16_8_ = uVar7;
    auVar12._0_16_ = *(undefined1 (*) [16])*in_RDI;
    auVar12._24_8_ = uVar8;
    auVar15 = vinsertf64x4_avx512f
                        (ZEXT3264(CONCAT824(uVar8,CONCAT816(uVar7,*(undefined1 (*) [16])*in_RDI))),
                         auVar12,1);
    for (; local_a84 + 3 < in_ECX; local_a84 = local_a84 + 4) {
      fVar1 = *local_818;
      fVar2 = local_818[1];
      fVar3 = local_818[2];
      auVar11._4_4_ = fVar3;
      auVar11._0_4_ = fVar3;
      auVar11._12_4_ = fVar3;
      auVar11._8_4_ = fVar3;
      fVar3 = local_818[3];
      auVar11._20_4_ = fVar3;
      auVar11._16_4_ = fVar3;
      auVar11._28_4_ = fVar3;
      auVar11._24_4_ = fVar3;
      auVar14 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(CONCAT44(fVar2,fVar2),
                                              CONCAT816(CONCAT44(fVar2,fVar2),
                                                        CONCAT88(CONCAT44(fVar1,fVar1),
                                                                 CONCAT44(fVar1,fVar1))))),auVar11,1
                          );
      auVar14 = vmulps_avx512f(auVar15,auVar14);
      local_c00 = auVar14._0_8_;
      uStack_bf8 = auVar14._8_8_;
      uStack_bf0 = auVar14._16_8_;
      uStack_be8 = auVar14._24_8_;
      uStack_be0 = auVar14._32_8_;
      uStack_bd8 = auVar14._40_8_;
      uStack_bd0 = auVar14._48_8_;
      uStack_bc8 = auVar14._56_8_;
      *local_820 = local_c00;
      local_820[1] = uStack_bf8;
      local_820[2] = uStack_bf0;
      local_820[3] = uStack_be8;
      local_820[4] = uStack_be0;
      local_820[5] = uStack_bd8;
      local_820[6] = uStack_bd0;
      local_820[7] = uStack_bc8;
      local_818 = local_818 + 4;
      local_820 = local_820 + 8;
    }
    while( true ) {
      local_a0 = (float)uVar7;
      fStack_9c = (float)((ulong)uVar7 >> 0x20);
      fStack_98 = (float)uVar8;
      fStack_94 = (float)((ulong)uVar8 >> 0x20);
      if (in_ECX <= local_a84 + 1) break;
      fVar1 = *local_818;
      fVar2 = local_818[1];
      *local_820 = CONCAT44(fStack_9c * fVar1,local_a0 * fVar1);
      local_820[1] = CONCAT44(fStack_94 * fVar1,fStack_98 * fVar1);
      local_820[2] = CONCAT44(fStack_9c * fVar2,local_a0 * fVar2);
      local_820[3] = CONCAT44(fStack_94,fStack_98 * fVar2);
      local_818 = local_818 + 2;
      local_820 = local_820 + 4;
      local_a84 = local_a84 + 2;
    }
    for (; local_a84 < in_ECX; local_a84 = local_a84 + 1) {
      fVar1 = *local_818;
      *local_820 = CONCAT44(fStack_9c * fVar1,local_a0 * fVar1);
      local_820[1] = CONCAT44(fStack_94 * fVar1,fStack_98 * fVar1);
      local_818 = local_818 + 1;
      local_820 = local_820 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}